

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_bcast_parts
          (REF_MPI ref_mpi,REF_INT *part_complete,REF_INT *part_ncell,REF_INT max_ncell,
          REF_INT node_per,REF_DBL *param_6,REF_INT *ncell,REF_DBL **xyz)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined4 in_register_00000084;
  long lVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  
  lVar14 = (long)*part_complete;
  if (*part_complete < ref_mpi->n) {
    iVar3 = part_ncell[lVar14];
    lVar2 = lVar14 << 0x20;
    lVar12 = lVar14;
    do {
      lVar10 = lVar2;
      lVar12 = lVar12 + 1;
      *(int *)param_6 = iVar3;
      if (ref_mpi->n <= lVar12) break;
      iVar3 = iVar3 + part_ncell[lVar12];
      lVar2 = lVar10 + 0x100000000;
    } while (iVar3 < 0xf4241);
    *part_complete = (REF_INT)lVar12;
    iVar3 = (int)((long)max_ncell * 3);
    uVar4 = *(int *)param_6 * iVar3;
    if (-1 < (int)uVar4) {
      pvVar6 = malloc((ulong)uVar4 << 3);
      *(void **)ncell = pvVar6;
      if (pvVar6 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x64e,"ref_phys_bcast_parts","malloc *xyz of REF_DBL NULL");
        return 2;
      }
      iVar13 = 0;
      do {
        lVar12 = (long)iVar13;
        if (lVar10 >> 0x20 < lVar14) {
          lVar14 = (long)*(int *)param_6 * (long)max_ncell * 3;
          iVar3 = (int)lVar14;
          if (iVar3 != iVar13) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x664,"ref_phys_bcast_parts","miscount",lVar14,lVar12);
          }
          return (uint)(iVar3 != iVar13);
        }
        iVar1 = part_ncell[lVar14];
        uVar4 = iVar1 * iVar3;
        if (ref_mpi->id == (int)lVar14) {
          if (0 < iVar1) {
            uVar5 = ref_mpi_bcast_from_rank
                              (ref_mpi,(void *)CONCAT44(in_register_00000084,node_per),uVar4,3,
                               ref_mpi->id);
            if (uVar5 != 0) {
              uVar9 = 0x657;
              goto LAB_001bc3c0;
            }
            uVar7 = 0;
            if (0 < (int)uVar4) {
              uVar7 = (ulong)uVar4;
            }
            for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
              *(undefined8 *)(*(long *)ncell + lVar12 * 8 + uVar8 * 8) =
                   *(undefined8 *)((long)CONCAT44(in_register_00000084,node_per) + uVar8 * 8);
            }
          }
        }
        else if ((0 < iVar1) &&
                (uVar5 = ref_mpi_bcast_from_rank
                                   (ref_mpi,(void *)(lVar12 * 8 + *(long *)ncell),uVar4,3,
                                    (int)lVar14), uVar5 != 0)) {
          uVar9 = 0x65e;
LAB_001bc3c0:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 uVar9,"ref_phys_bcast_parts",(ulong)uVar5,"bcast ncell");
          return uVar5;
        }
        iVar13 = iVar13 + uVar4;
        lVar14 = lVar14 + 1;
      } while( true );
    }
    pcVar11 = "malloc *xyz of REF_DBL negative";
    uVar9 = 0x64e;
  }
  else {
    pcVar11 = "already complete";
    uVar9 = 0x641;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar9,
         "ref_phys_bcast_parts",pcVar11);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_phys_bcast_parts(
    REF_MPI ref_mpi, REF_INT *part_complete, REF_INT *part_ncell,
    REF_INT max_ncell, REF_INT node_per, REF_DBL *local_xyz, REF_INT *ncell,
    REF_DBL **xyz) {
  REF_INT total;
  REF_INT first_part, last_part;
  REF_INT offset, part, i;
  RAS(*part_complete < ref_mpi_n(ref_mpi), "already complete");
  first_part = *part_complete;
  last_part = *part_complete;
  (*ncell) = part_ncell[first_part];

  for (part = first_part + 1; part < ref_mpi_n(ref_mpi); part++) {
    if ((*ncell) + part_ncell[part] > max_ncell) break;
    last_part = part;
    (*ncell) += part_ncell[part];
  }
  (*part_complete) = last_part + 1;

  total = 3 * node_per * (*ncell);
  ref_malloc(*xyz, total, REF_DBL);

  offset = 0;
  for (part = first_part; part <= last_part; part++) {
    total = 3 * node_per * part_ncell[part];
    if (part == ref_mpi_rank(ref_mpi)) {
      if (part_ncell[part] > 0) {
        RSS(ref_mpi_bcast_from_rank(ref_mpi, local_xyz, total, REF_DBL_TYPE,
                                    part),
            "bcast ncell");
        for (i = 0; i < total; i++) (*xyz)[i + offset] = local_xyz[i];
      }
    } else {
      if (part_ncell[part] > 0) {
        RSS(ref_mpi_bcast_from_rank(ref_mpi, &((*xyz)[offset]), total,
                                    REF_DBL_TYPE, part),
            "bcast ncell");
      }
    }
    offset += total;
  }
  total = 3 * node_per * (*ncell);
  REIS(total, offset, "miscount");

  return REF_SUCCESS;
}